

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParameterizedTestSuiteInfo<bssl::VerifyNameMatchDifferingTypesTest> * __thiscall
testing::internal::ParameterizedTestSuiteRegistry::
GetTestSuitePatternHolder<bssl::VerifyNameMatchDifferingTypesTest>
          (ParameterizedTestSuiteRegistry *this,string *test_suite_name,CodeLocation *code_location)

{
  ParameterizedTestSuiteInfoBase *base;
  int iVar1;
  iterator iVar2;
  undefined4 extraout_var;
  ParameterizedTestSuiteInfo<bssl::VerifyNameMatchDifferingTypesTest> *pPVar3;
  ParameterizedTestSuiteInfo<bssl::VerifyNameMatchDifferingTypesTest> *local_80;
  string local_78;
  CodeLocation local_58;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->suite_name_to_info_index_)._M_h,test_suite_name);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
      ._M_cur != (__node_type *)0x0) {
    base = (this->test_suite_infos_).
           super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
           ._M_impl.super__Vector_impl_data._M_start
           [*(long *)((long)iVar2.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                            ._M_cur + 0x28)];
    iVar1 = (*base->_vptr_ParameterizedTestSuiteInfoBase[3])(base);
    if ((undefined1 *)CONCAT44(extraout_var,iVar1) !=
        &TypeIdHelper<bssl::VerifyNameMatchDifferingTypesTest>::dummy_) {
      ReportInvalidTestSuiteType((test_suite_name->_M_dataplus)._M_p,code_location);
      posix::Abort();
    }
    pPVar3 = CheckedDowncastToActualType<testing::internal::ParameterizedTestSuiteInfo<bssl::VerifyNameMatchDifferingTypesTest>,testing::internal::ParameterizedTestSuiteInfoBase>
                       (base);
    if (pPVar3 != (ParameterizedTestSuiteInfo<bssl::VerifyNameMatchDifferingTypesTest> *)0x0) {
      return pPVar3;
    }
  }
  pPVar3 = (ParameterizedTestSuiteInfo<bssl::VerifyNameMatchDifferingTypesTest> *)operator_new(0x80)
  ;
  std::__cxx11::string::string((string *)&local_78,(string *)test_suite_name);
  CodeLocation::CodeLocation(&local_58,code_location);
  ParameterizedTestSuiteInfo<bssl::VerifyNameMatchDifferingTypesTest>::ParameterizedTestSuiteInfo
            (pPVar3,&local_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  local_80 = (ParameterizedTestSuiteInfo<bssl::VerifyNameMatchDifferingTypesTest> *)
             ((long)(this->test_suite_infos_).
                    super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->test_suite_infos_).
                    super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::__cxx11::string,unsigned_long>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->suite_name_to_info_index_,test_suite_name,&local_80);
  local_80 = pPVar3;
  std::
  vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
  ::emplace_back<testing::internal::ParameterizedTestSuiteInfoBase*>
            ((vector<testing::internal::ParameterizedTestSuiteInfoBase*,std::allocator<testing::internal::ParameterizedTestSuiteInfoBase*>>
              *)this,(ParameterizedTestSuiteInfoBase **)&local_80);
  return pPVar3;
}

Assistant:

ParameterizedTestSuiteInfo<TestSuite>* GetTestSuitePatternHolder(
      std::string test_suite_name, CodeLocation code_location) {
    ParameterizedTestSuiteInfo<TestSuite>* typed_test_info = nullptr;

    auto item_it = suite_name_to_info_index_.find(test_suite_name);
    if (item_it != suite_name_to_info_index_.end()) {
      auto* test_suite_info = test_suite_infos_[item_it->second];
      if (test_suite_info->GetTestSuiteTypeId() != GetTypeId<TestSuite>()) {
        // Complain about incorrect usage of Google Test facilities
        // and terminate the program since we cannot guaranty correct
        // test suite setup and tear-down in this case.
        ReportInvalidTestSuiteType(test_suite_name.c_str(), code_location);
        posix::Abort();
      } else {
        // At this point we are sure that the object we found is of the same
        // type we are looking for, so we downcast it to that type
        // without further checks.
        typed_test_info =
            CheckedDowncastToActualType<ParameterizedTestSuiteInfo<TestSuite>>(
                test_suite_info);
      }
    }
    if (typed_test_info == nullptr) {
      typed_test_info = new ParameterizedTestSuiteInfo<TestSuite>(
          test_suite_name, std::move(code_location));
      suite_name_to_info_index_.emplace(std::move(test_suite_name),
                                        test_suite_infos_.size());
      test_suite_infos_.push_back(typed_test_info);
    }
    return typed_test_info;
  }